

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair_mat.h
# Opt level: O0

int encode_char(char c)

{
  int iVar1;
  char *pcVar2;
  char in_DIL;
  char *pos;
  int code;
  int local_8;
  
  iVar1 = toupper((int)in_DIL);
  if (energy_set < 1) {
    pcVar2 = strchr("_ACGUTXKI",(int)(char)iVar1);
    if (pcVar2 == (char *)0x0) {
      local_8 = 0;
    }
    else {
      local_8 = (int)pcVar2 + -0x15593b;
    }
    if (5 < local_8) {
      local_8 = 0;
    }
    if (4 < local_8) {
      local_8 = local_8 + -1;
    }
  }
  else {
    local_8 = (char)iVar1 + -0x40;
  }
  return local_8;
}

Assistant:

static INLINE int
encode_char(char c)
{
  /* return numerical representation of base used e.g. in pair[][] */
  int code;

  c = toupper(c);

  if (energy_set > 0) {
    code = (int)(c - 'A') + 1;
  } else {
    const char *pos;
    pos = strchr(Law_and_Order, c);
    if (pos == NULL)
      code = 0;
    else
      code = (int)(pos - Law_and_Order);

    if (code > 5)
      code = 0;

    if (code > 4)
      code--;           /* make T and U equivalent */
  }

  return code;
}